

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerHLSL::to_resource_binding_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRVariable *var)

{
  StorageClass SVar1;
  bool bVar2;
  byte bVar3;
  uint32_t space_set;
  SPIRType *pSVar4;
  byte space;
  HLSLBindingFlagBits flag;
  uint32_t binding;
  Bitset flags;
  Bitset local_70;
  
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(var->super_IVariant).field_0xc);
  if ((pSVar4->storage != PushConstant) &&
     (bVar2 = Compiler::has_decoration((Compiler *)this,(ID)(var->super_IVariant).self.id,Binding),
     !bVar2)) goto LAB_001d9f0a;
  switch(pSVar4->basetype) {
  case Struct:
    SVar1 = pSVar4->storage;
    if (SVar1 == StorageBuffer) {
      ParsedIR::get_buffer_block_flags(&local_70,&(this->super_CompilerGLSL).super_Compiler.ir,var);
      if ((local_70.lower._3_1_ & 1) == 0) {
LAB_001d9e47:
        bVar3 = 0;
      }
      else {
        bVar2 = is_hlsl_force_storage_buffer_as_uav(this,(ID)(var->super_IVariant).self.id);
LAB_001d9e57:
        bVar3 = bVar2 ^ 1;
      }
      space = bVar3 ^ 0x75;
      flag = (uint)(bVar3 ^ 1) * 4 + HLSL_BINDING_AUTO_SRV_BIT;
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_70.higher._M_h);
    }
    else if (SVar1 == PushConstant) {
      space = 0x62;
      flag = HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT;
    }
    else {
      if (SVar1 != StorageClassUniform) goto switchD_001d9d39_default;
      bVar2 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(pSVar4->super_IVariant).self.id,BufferBlock);
      if (bVar2) {
        ParsedIR::get_buffer_block_flags
                  (&local_70,&(this->super_CompilerGLSL).super_Compiler.ir,var);
        if ((local_70.lower._3_1_ & 1) == 0) goto LAB_001d9e47;
        bVar2 = is_hlsl_force_storage_buffer_as_uav(this,(ID)(var->super_IVariant).self.id);
        goto LAB_001d9e57;
      }
      bVar2 = Compiler::has_decoration((Compiler *)this,(ID)(pSVar4->super_IVariant).self.id,Block);
      flag = (uint)bVar2 + (uint)bVar2;
      space = 0x62;
      if (!bVar2) {
        space = 0;
      }
    }
    break;
  case Image:
    space = 0x74;
    flag = HLSL_BINDING_AUTO_SRV_BIT;
    if ((((pSVar4->image).sampled == 2) && ((pSVar4->image).dim != DimSubpassData)) &&
       ((bVar2 = Compiler::has_decoration
                           ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationNonWritable
                           ), !bVar2 ||
        ((this->hlsl_options).nonwritable_uav_texture_as_srv == false)))) {
      space = 0x75;
      flag = HLSL_BINDING_AUTO_UAV_BIT;
    }
    break;
  case SampledImage:
  case AccelerationStructure:
    space = 0x74;
    flag = HLSL_BINDING_AUTO_SRV_BIT;
    break;
  case Sampler:
    space = 0x73;
    flag = HLSL_BINDING_AUTO_SAMPLER_BIT;
    break;
  default:
switchD_001d9d39_default:
    flag = HLSL_BINDING_AUTO_NONE_BIT;
    space = 0;
  }
  if (space != 0) {
    bVar2 = Compiler::has_decoration((Compiler *)this,(ID)(var->super_IVariant).self.id,Binding);
    binding = 0;
    if (bVar2) {
      binding = Compiler::get_decoration((Compiler *)this,(ID)(var->super_IVariant).self.id,Binding)
      ;
    }
    bVar2 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationDescriptorSet);
    if (bVar2) {
      space_set = Compiler::get_decoration
                            ((Compiler *)this,(ID)(var->super_IVariant).self.id,
                             DecorationDescriptorSet);
    }
    else {
      space_set = -(uint)(flag == HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT);
    }
    to_resource_register_abi_cxx11_(__return_storage_ptr__,this,flag,space,binding,space_set);
    return __return_storage_ptr__;
  }
LAB_001d9f0a:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::to_resource_binding(const SPIRVariable &var)
{
	const auto &type = get<SPIRType>(var.basetype);

	// We can remap push constant blocks, even if they don't have any binding decoration.
	if (type.storage != StorageClassPushConstant && !has_decoration(var.self, DecorationBinding))
		return "";

	char space = '\0';

	HLSLBindingFlagBits resource_flags = HLSL_BINDING_AUTO_NONE_BIT;

	switch (type.basetype)
	{
	case SPIRType::SampledImage:
		space = 't'; // SRV
		resource_flags = HLSL_BINDING_AUTO_SRV_BIT;
		break;

	case SPIRType::Image:
		if (type.image.sampled == 2 && type.image.dim != DimSubpassData)
		{
			if (has_decoration(var.self, DecorationNonWritable) && hlsl_options.nonwritable_uav_texture_as_srv)
			{
				space = 't'; // SRV
				resource_flags = HLSL_BINDING_AUTO_SRV_BIT;
			}
			else
			{
				space = 'u'; // UAV
				resource_flags = HLSL_BINDING_AUTO_UAV_BIT;
			}
		}
		else
		{
			space = 't'; // SRV
			resource_flags = HLSL_BINDING_AUTO_SRV_BIT;
		}
		break;

	case SPIRType::Sampler:
		space = 's';
		resource_flags = HLSL_BINDING_AUTO_SAMPLER_BIT;
		break;

	case SPIRType::AccelerationStructure:
		space = 't'; // SRV
		resource_flags = HLSL_BINDING_AUTO_SRV_BIT;
		break;

	case SPIRType::Struct:
	{
		auto storage = type.storage;
		if (storage == StorageClassUniform)
		{
			if (has_decoration(type.self, DecorationBufferBlock))
			{
				Bitset flags = ir.get_buffer_block_flags(var);
				bool is_readonly = flags.get(DecorationNonWritable) && !is_hlsl_force_storage_buffer_as_uav(var.self);
				space = is_readonly ? 't' : 'u'; // UAV
				resource_flags = is_readonly ? HLSL_BINDING_AUTO_SRV_BIT : HLSL_BINDING_AUTO_UAV_BIT;
			}
			else if (has_decoration(type.self, DecorationBlock))
			{
				space = 'b'; // Constant buffers
				resource_flags = HLSL_BINDING_AUTO_CBV_BIT;
			}
		}
		else if (storage == StorageClassPushConstant)
		{
			space = 'b'; // Constant buffers
			resource_flags = HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT;
		}
		else if (storage == StorageClassStorageBuffer)
		{
			// UAV or SRV depending on readonly flag.
			Bitset flags = ir.get_buffer_block_flags(var);
			bool is_readonly = flags.get(DecorationNonWritable) && !is_hlsl_force_storage_buffer_as_uav(var.self);
			space = is_readonly ? 't' : 'u';
			resource_flags = is_readonly ? HLSL_BINDING_AUTO_SRV_BIT : HLSL_BINDING_AUTO_UAV_BIT;
		}

		break;
	}
	default:
		break;
	}

	if (!space)
		return "";

	uint32_t desc_set =
	    resource_flags == HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT ? ResourceBindingPushConstantDescriptorSet : 0u;
	uint32_t binding = resource_flags == HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT ? ResourceBindingPushConstantBinding : 0u;

	if (has_decoration(var.self, DecorationBinding))
		binding = get_decoration(var.self, DecorationBinding);
	if (has_decoration(var.self, DecorationDescriptorSet))
		desc_set = get_decoration(var.self, DecorationDescriptorSet);

	return to_resource_register(resource_flags, space, binding, desc_set);
}